

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_hdr_scanline
               (stbi__write_context *s,int width,int ncomp,uchar *scratch,float *scanline)

{
  stbi__write_context *s_00;
  uchar *puVar1;
  stbi__write_context *s_01;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000034;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uchar rgbe [4];
  uchar scanlineheader [4];
  uchar local_84;
  uchar local_83;
  uchar local_82;
  uchar local_81;
  float local_80;
  float local_7c;
  float local_78;
  undefined4 local_74;
  uchar *local_70;
  ulong local_68;
  stbi__write_context *local_60;
  undefined8 local_58;
  long local_50;
  uchar *local_48;
  uchar *local_40;
  long local_38;
  
  local_58 = CONCAT44(in_register_00000034,width);
  local_74 = CONCAT22((ushort)width << 8 | (ushort)width >> 8,0x202);
  local_70 = scratch;
  local_60 = s;
  if (width - 0x8000U < 0xffff8008) {
    if (0 < width) {
      uVar9 = (ulong)(uint)width;
      do {
        if (ncomp - 3U < 2) {
          local_78 = scanline[2];
          local_7c = scanline[1];
          local_80 = *scanline;
        }
        else {
          local_80 = *scanline;
          local_7c = local_80;
          local_78 = local_80;
        }
        stbiw__linear_to_rgbe(&local_84,&local_80);
        (*local_60->func)(local_60->context,&local_84,4);
        scanline = scanline + ncomp;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else {
    local_68 = (ulong)(uint)width;
    if (0 < width) {
      local_48 = scratch + local_68;
      uVar9 = 0;
      do {
        if (ncomp - 3U < 2) {
          local_78 = scanline[2];
          local_7c = scanline[1];
          local_80 = *scanline;
        }
        else {
          local_80 = *scanline;
          local_7c = local_80;
          local_78 = local_80;
        }
        stbiw__linear_to_rgbe(&local_84,&local_80);
        local_70[uVar9] = local_84;
        local_48[uVar9] = local_83;
        scratch[uVar9 + (uint)(width * 2)] = local_82;
        scratch[uVar9 + (uint)(width * 3)] = local_81;
        uVar9 = uVar9 + 1;
        scanline = scanline + ncomp;
      } while (local_68 != uVar9);
    }
    uVar9 = local_68;
    (*local_60->func)(local_60->context,&local_74,4);
    lVar3 = uVar9 - 3;
    local_48 = local_70 + 2;
    local_50 = 0;
    local_40 = local_70;
    uVar4 = local_58;
    local_38 = lVar3;
    do {
      puVar1 = local_70;
      if (0 < (int)uVar4) {
        lVar10 = local_50 * local_68;
        iVar8 = 0;
        do {
          s_01 = local_60;
          iVar6 = (int)uVar4;
          s_00 = local_60;
          iVar7 = iVar6;
          if (iVar8 + 2 < iVar6) {
            lVar2 = (long)iVar8 + -1;
            iVar5 = iVar8;
            do {
              if ((local_48[lVar2 + -1] == local_48[lVar2]) &&
                 (iVar7 = iVar5, local_48[lVar2 + -1] == local_48[lVar2 + 1])) break;
              iVar5 = iVar5 + 1;
              lVar2 = lVar2 + 1;
              iVar7 = iVar6;
            } while (lVar2 < lVar3);
          }
          for (; local_60 = s_00, iVar8 < iVar7; iVar8 = iVar8 + iVar6) {
            iVar6 = iVar7 - iVar8;
            if (0x7f < iVar6) {
              iVar6 = 0x80;
            }
            stbiw__write_dump_data(s_01,iVar6,puVar1 + iVar8 + lVar10);
            s_00 = local_60;
          }
          iVar6 = (int)local_58;
          if (iVar7 + 2 < iVar6) {
            lVar3 = (long)iVar7;
            iVar5 = iVar7 + 1;
            if (iVar7 + 1 < iVar6) {
              iVar5 = iVar6;
            }
            do {
              if (local_40[lVar3] != puVar1[iVar8 + lVar10]) {
                iVar5 = (int)lVar3;
                break;
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < (long)local_68);
            for (; iVar8 < iVar5; iVar8 = iVar8 + iVar7) {
              iVar7 = iVar5 - iVar8;
              if (0x7e < iVar7) {
                iVar7 = 0x7f;
              }
              stbiw__write_run_data(s_00,iVar7,puVar1[iVar8 + lVar10]);
            }
          }
          uVar4 = local_58;
          lVar3 = local_38;
        } while (iVar8 < (int)local_58);
      }
      local_50 = local_50 + 1;
      local_48 = local_48 + local_68;
      local_40 = local_40 + local_68;
    } while (local_50 != 4);
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(stbi__write_context *s, int width, int ncomp, unsigned char *scratch, float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         s->func(s->context, rgbe, 4);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      s->func(s->context, scanlineheader, 4);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(s, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(s, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}